

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LSTMWeightParams::MergeFrom(LSTMWeightParams *this,LSTMWeightParams *from)

{
  bool bVar1;
  LogMessage *other;
  WeightParams *pWVar2;
  WeightParams *pWVar3;
  InternalMetadataWithArenaLite *this_00;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  LSTMWeightParams *local_58;
  LSTMWeightParams *from_local;
  LSTMWeightParams *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xb02b);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_00 = &this->_internal_metadata_;
  this_local = (LSTMWeightParams *)&local_58->_internal_metadata_;
  local_40 = this_00;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_00,&local_20->unknown_fields);
  }
  bVar1 = has_inputgateweightmatrix(local_58);
  if (bVar1) {
    pWVar2 = mutable_inputgateweightmatrix(this);
    pWVar3 = inputgateweightmatrix(local_58);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = has_forgetgateweightmatrix(local_58);
  if (bVar1) {
    pWVar2 = mutable_forgetgateweightmatrix(this);
    pWVar3 = forgetgateweightmatrix(local_58);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = has_blockinputweightmatrix(local_58);
  if (bVar1) {
    pWVar2 = mutable_blockinputweightmatrix(this);
    pWVar3 = blockinputweightmatrix(local_58);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = has_outputgateweightmatrix(local_58);
  if (bVar1) {
    pWVar2 = mutable_outputgateweightmatrix(this);
    pWVar3 = outputgateweightmatrix(local_58);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = has_inputgaterecursionmatrix(local_58);
  if (bVar1) {
    pWVar2 = mutable_inputgaterecursionmatrix(this);
    pWVar3 = inputgaterecursionmatrix(local_58);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = has_forgetgaterecursionmatrix(local_58);
  if (bVar1) {
    pWVar2 = mutable_forgetgaterecursionmatrix(this);
    pWVar3 = forgetgaterecursionmatrix(local_58);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = has_blockinputrecursionmatrix(local_58);
  if (bVar1) {
    pWVar2 = mutable_blockinputrecursionmatrix(this);
    pWVar3 = blockinputrecursionmatrix(local_58);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = has_outputgaterecursionmatrix(local_58);
  if (bVar1) {
    pWVar2 = mutable_outputgaterecursionmatrix(this);
    pWVar3 = outputgaterecursionmatrix(local_58);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = has_inputgatebiasvector(local_58);
  if (bVar1) {
    pWVar2 = mutable_inputgatebiasvector(this);
    pWVar3 = inputgatebiasvector(local_58);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = has_forgetgatebiasvector(local_58);
  if (bVar1) {
    pWVar2 = mutable_forgetgatebiasvector(this);
    pWVar3 = forgetgatebiasvector(local_58);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = has_blockinputbiasvector(local_58);
  if (bVar1) {
    pWVar2 = mutable_blockinputbiasvector(this);
    pWVar3 = blockinputbiasvector(local_58);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = has_outputgatebiasvector(local_58);
  if (bVar1) {
    pWVar2 = mutable_outputgatebiasvector(this);
    pWVar3 = outputgatebiasvector(local_58);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = has_inputgatepeepholevector(local_58);
  if (bVar1) {
    pWVar2 = mutable_inputgatepeepholevector(this);
    pWVar3 = inputgatepeepholevector(local_58);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = has_forgetgatepeepholevector(local_58);
  if (bVar1) {
    pWVar2 = mutable_forgetgatepeepholevector(this);
    pWVar3 = forgetgatepeepholevector(local_58);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  bVar1 = has_outputgatepeepholevector(local_58);
  if (bVar1) {
    pWVar2 = mutable_outputgatepeepholevector(this);
    pWVar3 = outputgatepeepholevector(local_58);
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  return;
}

Assistant:

void LSTMWeightParams::MergeFrom(const LSTMWeightParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.LSTMWeightParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_inputgateweightmatrix()) {
    mutable_inputgateweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.inputgateweightmatrix());
  }
  if (from.has_forgetgateweightmatrix()) {
    mutable_forgetgateweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.forgetgateweightmatrix());
  }
  if (from.has_blockinputweightmatrix()) {
    mutable_blockinputweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.blockinputweightmatrix());
  }
  if (from.has_outputgateweightmatrix()) {
    mutable_outputgateweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.outputgateweightmatrix());
  }
  if (from.has_inputgaterecursionmatrix()) {
    mutable_inputgaterecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.inputgaterecursionmatrix());
  }
  if (from.has_forgetgaterecursionmatrix()) {
    mutable_forgetgaterecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.forgetgaterecursionmatrix());
  }
  if (from.has_blockinputrecursionmatrix()) {
    mutable_blockinputrecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.blockinputrecursionmatrix());
  }
  if (from.has_outputgaterecursionmatrix()) {
    mutable_outputgaterecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from.outputgaterecursionmatrix());
  }
  if (from.has_inputgatebiasvector()) {
    mutable_inputgatebiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from.inputgatebiasvector());
  }
  if (from.has_forgetgatebiasvector()) {
    mutable_forgetgatebiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from.forgetgatebiasvector());
  }
  if (from.has_blockinputbiasvector()) {
    mutable_blockinputbiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from.blockinputbiasvector());
  }
  if (from.has_outputgatebiasvector()) {
    mutable_outputgatebiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from.outputgatebiasvector());
  }
  if (from.has_inputgatepeepholevector()) {
    mutable_inputgatepeepholevector()->::CoreML::Specification::WeightParams::MergeFrom(from.inputgatepeepholevector());
  }
  if (from.has_forgetgatepeepholevector()) {
    mutable_forgetgatepeepholevector()->::CoreML::Specification::WeightParams::MergeFrom(from.forgetgatepeepholevector());
  }
  if (from.has_outputgatepeepholevector()) {
    mutable_outputgatepeepholevector()->::CoreML::Specification::WeightParams::MergeFrom(from.outputgatepeepholevector());
  }
}